

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void analyzeTable(Parse *pParse,Table *pTab,Index *pOnlyIdx)

{
  int iStatCur;
  Schema *pSVar1;
  Index *pIVar2;
  Schema **ppSVar3;
  int iDb;
  char *zWhereType;
  
  if (pTab->pSchema == (Schema *)0x0) {
    iDb = -0x8000;
  }
  else {
    iDb = -1;
    ppSVar3 = &pParse->db->aDb->pSchema;
    do {
      iDb = iDb + 1;
      pSVar1 = *ppSVar3;
      ppSVar3 = ppSVar3 + 4;
    } while (pSVar1 != pTab->pSchema);
  }
  sqlite3BeginWriteOperation(pParse,0,iDb);
  iStatCur = pParse->nTab;
  pParse->nTab = iStatCur + 3;
  pIVar2 = pOnlyIdx;
  if (pOnlyIdx == (Index *)0x0) {
    pIVar2 = (Index *)pTab;
  }
  zWhereType = "idx";
  if (pOnlyIdx == (Index *)0x0) {
    zWhereType = "tbl";
  }
  openStatTable(pParse,iDb,iStatCur,pIVar2->zName,zWhereType);
  analyzeOneTable(pParse,pTab,pOnlyIdx,iStatCur,pParse->nMem + 1,pParse->nTab);
  loadAnalysis(pParse,iDb);
  return;
}

Assistant:

static void analyzeTable(Parse *pParse, Table *pTab, Index *pOnlyIdx){
  int iDb;
  int iStatCur;

  assert( pTab!=0 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  if( pOnlyIdx ){
    openStatTable(pParse, iDb, iStatCur, pOnlyIdx->zName, "idx");
  }else{
    openStatTable(pParse, iDb, iStatCur, pTab->zName, "tbl");
  }
  analyzeOneTable(pParse, pTab, pOnlyIdx, iStatCur,pParse->nMem+1,pParse->nTab);
  loadAnalysis(pParse, iDb);
}